

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaAttrInfoPtr xmlSchemaGetFreshAttrInfo(xmlSchemaValidCtxtPtr vctxt)

{
  int iVar1;
  xmlSchemaAttrInfoPtr pxVar2;
  xmlSchemaAttrInfoPtr *ppxVar3;
  xmlSchemaAttrInfoPtr iattr;
  xmlSchemaValidCtxtPtr vctxt_local;
  
  if (vctxt->attrInfos == (xmlSchemaAttrInfoPtr *)0x0) {
    ppxVar3 = (xmlSchemaAttrInfoPtr *)(*xmlMalloc)(8);
    vctxt->attrInfos = ppxVar3;
    vctxt->sizeAttrInfos = 1;
    if (vctxt->attrInfos == (xmlSchemaAttrInfoPtr *)0x0) {
      xmlSchemaVErrMemory(vctxt,"allocating attribute info list",(xmlNodePtr)0x0);
      return (xmlSchemaAttrInfoPtr)0x0;
    }
  }
  else {
    if (vctxt->nbAttrInfos < vctxt->sizeAttrInfos) {
      iVar1 = vctxt->nbAttrInfos;
      vctxt->nbAttrInfos = iVar1 + 1;
      pxVar2 = vctxt->attrInfos[iVar1];
      if (pxVar2->localName != (xmlChar *)0x0) {
        xmlSchemaInternalErr
                  ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaGetFreshAttrInfo",
                   "attr info not cleared");
        return (xmlSchemaAttrInfoPtr)0x0;
      }
      pxVar2->nodeType = 2;
      return pxVar2;
    }
    vctxt->sizeAttrInfos = vctxt->sizeAttrInfos + 1;
    ppxVar3 = (xmlSchemaAttrInfoPtr *)
              (*xmlRealloc)(vctxt->attrInfos,(long)vctxt->sizeAttrInfos << 3);
    vctxt->attrInfos = ppxVar3;
    if (vctxt->attrInfos == (xmlSchemaAttrInfoPtr *)0x0) {
      xmlSchemaVErrMemory(vctxt,"re-allocating attribute info list",(xmlNodePtr)0x0);
      return (xmlSchemaAttrInfoPtr)0x0;
    }
  }
  vctxt_local = (xmlSchemaValidCtxtPtr)(*xmlMalloc)(0x70);
  if (vctxt_local == (xmlSchemaValidCtxtPtr)0x0) {
    xmlSchemaVErrMemory(vctxt,"creating new attribute info",(xmlNodePtr)0x0);
    vctxt_local = (xmlSchemaValidCtxtPtr)0x0;
  }
  else {
    memset(vctxt_local,0,0x70);
    vctxt_local->type = 2;
    iVar1 = vctxt->nbAttrInfos;
    vctxt->nbAttrInfos = iVar1 + 1;
    vctxt->attrInfos[iVar1] = (xmlSchemaAttrInfoPtr)vctxt_local;
  }
  return (xmlSchemaAttrInfoPtr)vctxt_local;
}

Assistant:

static xmlSchemaAttrInfoPtr
xmlSchemaGetFreshAttrInfo(xmlSchemaValidCtxtPtr vctxt)
{
    xmlSchemaAttrInfoPtr iattr;
    /*
    * Grow/create list of attribute infos.
    */
    if (vctxt->attrInfos == NULL) {
	vctxt->attrInfos = (xmlSchemaAttrInfoPtr *)
	    xmlMalloc(sizeof(xmlSchemaAttrInfoPtr));
	vctxt->sizeAttrInfos = 1;
	if (vctxt->attrInfos == NULL) {
	    xmlSchemaVErrMemory(vctxt,
		"allocating attribute info list", NULL);
	    return (NULL);
	}
    } else if (vctxt->sizeAttrInfos <= vctxt->nbAttrInfos) {
	vctxt->sizeAttrInfos++;
	vctxt->attrInfos = (xmlSchemaAttrInfoPtr *)
	    xmlRealloc(vctxt->attrInfos,
		vctxt->sizeAttrInfos * sizeof(xmlSchemaAttrInfoPtr));
	if (vctxt->attrInfos == NULL) {
	    xmlSchemaVErrMemory(vctxt,
		"re-allocating attribute info list", NULL);
	    return (NULL);
	}
    } else {
	iattr = vctxt->attrInfos[vctxt->nbAttrInfos++];
	if (iattr->localName != NULL) {
	    VERROR_INT("xmlSchemaGetFreshAttrInfo",
		"attr info not cleared");
	    return (NULL);
	}
	iattr->nodeType = XML_ATTRIBUTE_NODE;
	return (iattr);
    }
    /*
    * Create an attribute info.
    */
    iattr = (xmlSchemaAttrInfoPtr)
	xmlMalloc(sizeof(xmlSchemaAttrInfo));
    if (iattr == NULL) {
	xmlSchemaVErrMemory(vctxt, "creating new attribute info", NULL);
	return (NULL);
    }
    memset(iattr, 0, sizeof(xmlSchemaAttrInfo));
    iattr->nodeType = XML_ATTRIBUTE_NODE;
    vctxt->attrInfos[vctxt->nbAttrInfos++] = iattr;

    return (iattr);
}